

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void Cmd_dumpstates(FCommandLine *argv,APlayerPawn *who,int key)

{
  PClassActor *pPVar1;
  FStateLabels *StateList;
  ulong uVar2;
  FString FStack_38;
  
  for (uVar2 = 0; uVar2 < PClassActor::AllActorClasses.Count; uVar2 = uVar2 + 1) {
    pPVar1 = PClassActor::AllActorClasses.Array[uVar2];
    Printf(5,"State labels for %s\n",
           FName::NameData.NameArray
           [(pPVar1->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index
           ].Text);
    StateList = pPVar1->StateList;
    FString::FString(&FStack_38,(char *)"");
    DumpStateHelper(StateList,&FStack_38);
    FString::~FString(&FStack_38);
    Printf(5,"----------------------------\n");
  }
  return;
}

Assistant:

CCMD(dumpstates)
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		PClassActor *info = PClassActor::AllActorClasses[i];
		Printf(PRINT_LOG, "State labels for %s\n", info->TypeName.GetChars());
		DumpStateHelper(info->StateList, "");
		Printf(PRINT_LOG, "----------------------------\n");
	}
}